

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

timestamp_t __thiscall duckdb::timestamp_t::operator+(timestamp_t *this,double *value)

{
  bool bVar1;
  OutOfRangeException *this_00;
  timestamp_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TryAddOperator::Operation<long,long,long>(this->value,(long)*value,&local_48);
  if (bVar1) {
    return (timestamp_t)local_48;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Overflow in timestamp addition","");
  OutOfRangeException::OutOfRangeException(this_00,&local_40);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t timestamp_t::operator+(const double &value) const {
	timestamp_t result;
	if (!TryAddOperator::Operation(this->value, int64_t(value), result.value)) {
		throw OutOfRangeException("Overflow in timestamp addition");
	}
	return result;
}